

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paint.h
# Opt level: O3

void gimage::validRange<float>(Image<float,_gimage::PixelTraits<float>_> *image,float from,float to)

{
  float fVar1;
  long lVar2;
  long lVar3;
  float ***pppfVar4;
  float *pfVar5;
  long lVar6;
  int j;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar6 = (long)image->depth;
  if (0 < lVar6) {
    lVar2 = image->width;
    lVar3 = image->height;
    lVar8 = 0;
    do {
      if (0 < lVar3) {
        pppfVar4 = image->img;
        lVar9 = 0;
        do {
          if (0 < lVar2) {
            pfVar5 = pppfVar4[lVar8][lVar9];
            lVar10 = 0;
            do {
              fVar1 = pfVar5[lVar10];
              if ((uint)ABS(fVar1) < 0x7f800000 && (to < fVar1 || fVar1 < from)) {
                lVar7 = 0;
                do {
                  pppfVar4[lVar7][lVar9][lVar10] = INFINITY;
                  lVar7 = lVar7 + 1;
                } while (lVar6 != lVar7);
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 != lVar2);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != lVar3);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar6);
  }
  return;
}

Assistant:

void validRange(Image<T> &image, T from, T to)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        T v=image.get(i, k, d);

        if ((v < from || v > to) && image.isValidS(v))
        {
          for (int j=0; j<image.getDepth(); j++)
          {
            image.setInvalid(i, k, j);
          }
        }
      }
    }
  }
}